

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::ArrayFeatureExtractor::_internal_add_extractindex
          (ArrayFeatureExtractor *this,uint64_t value)

{
  uint64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->extractindex_,&local_8);
  return;
}

Assistant:

inline void ArrayFeatureExtractor::_internal_add_extractindex(uint64_t value) {
  extractindex_.Add(value);
}